

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O2

void pdf_init_document(hd_context *ctx,pdf_document *doc)

{
  byte bVar1;
  uint i;
  hd_error_stack_slot *phVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  size_t sVar6;
  pdf_obj *ppVar7;
  pdf_xref_entry *ppVar8;
  pdf_obj *ppVar9;
  long lVar10;
  byte *pbVar11;
  char *pcVar12;
  uint i_00;
  void *__s1;
  pdf_document *ppVar13;
  undefined8 in_R8;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  pdf_obj *dict;
  undefined8 local_448;
  pdf_obj *local_440;
  pdf_obj *nobj;
  
  dict = (pdf_obj *)0x0;
  hd_var_imp(&dict);
  iVar3 = hd_push_try(ctx);
  if ((iVar3 == 0) || (iVar3 = __sigsetjmp(ctx->error->top->buffer,0), iVar3 != 0)) {
LAB_00109ef6:
    phVar2 = ctx->error->top;
    ctx->error->top = phVar2 + -1;
    iVar3 = phVar2->code;
    if (1 < iVar3) {
      hd_rethrow_if(ctx,4);
      hd_warn(ctx,"trying to repair broken xref");
    }
    iVar4 = hd_push_try(ctx);
    if (((iVar4 != 0) && (iVar4 = __sigsetjmp(ctx->error->top->buffer,0), 1 < iVar3)) &&
       (iVar4 == 0)) {
      nobj = (pdf_obj *)0x0;
      hd_var_imp(&nobj);
      memset(doc->xref_index,0,(long)doc->max_xref_len << 2);
      ppVar13 = doc;
      pdf_repair_xref(ctx,doc);
      pdf_prime_xref_index((hd_context *)doc,ppVar13);
      iVar3 = doc->max_xref_len;
      pdf_repair_obj_stms(ctx,doc);
      if (doc->xref_sections == (pdf_xref *)0x0) {
        ppVar7 = (pdf_obj *)0x0;
      }
      else {
        ppVar7 = doc->xref_sections->trailer;
      }
      local_440 = pdf_dict_get(ctx,ppVar7,(pdf_obj *)0x12d);
      if (doc->xref_sections == (pdf_xref *)0x0) {
        ppVar7 = (pdf_obj *)0x0;
      }
      else {
        ppVar7 = doc->xref_sections->trailer;
      }
      ppVar7 = pdf_dict_get(ctx,ppVar7,(pdf_obj *)0xc1);
      for (uVar14 = 1; (int)uVar14 < iVar3; uVar14 = uVar14 + 1) {
        ppVar8 = pdf_get_xref_entry(ctx,doc,uVar14);
        if ((ppVar8->type != '\0') && (ppVar8->type != 'f')) {
          iVar4 = hd_push_try(ctx);
          if ((iVar4 != 0) && (iVar4 = __sigsetjmp(ctx->error->top->buffer,0), iVar4 == 0)) {
            dict = pdf_load_object(ctx,doc,uVar14);
          }
          phVar2 = ctx->error->top;
          ctx->error->top = phVar2 + -1;
          if (phVar2->code < 2) {
            if ((local_440 == (pdf_obj *)0x0) &&
               ((ppVar9 = pdf_dict_get(ctx,dict,(pdf_obj *)0x159), ppVar9 == (pdf_obj *)0x46 ||
                (((pdf_obj *)0x185 < ppVar9 &&
                 (iVar4 = pdf_objcmp_resolve(ctx,ppVar9,(pdf_obj *)0x46), iVar4 == 0)))))) {
              nobj = pdf_new_indirect(ctx,doc,uVar14,0);
              if (doc->xref_sections == (pdf_xref *)0x0) {
                ppVar9 = (pdf_obj *)0x0;
              }
              else {
                ppVar9 = doc->xref_sections->trailer;
              }
              pdf_dict_put_drop(ctx,ppVar9,(pdf_obj *)0x12d,nobj);
            }
            if ((ppVar7 == (pdf_obj *)0x0) &&
               ((ppVar9 = pdf_dict_get(ctx,dict,(pdf_obj *)0x55), ppVar9 != (pdf_obj *)0x0 ||
                (ppVar9 = pdf_dict_get(ctx,dict,(pdf_obj *)0x11d), ppVar9 != (pdf_obj *)0x0)))) {
              nobj = pdf_new_indirect(ctx,doc,uVar14,0);
              if (doc->xref_sections == (pdf_xref *)0x0) {
                ppVar9 = (pdf_obj *)0x0;
              }
              else {
                ppVar9 = doc->xref_sections->trailer;
              }
              pdf_dict_put_drop(ctx,ppVar9,(pdf_obj *)0xc1,nobj);
            }
            pdf_drop_obj(ctx,dict);
            dict = (pdf_obj *)0x0;
          }
          else {
            hd_rethrow_if(ctx,4);
            hd_warn(ctx,"ignoring broken object (%d 0 R)",(ulong)uVar14);
          }
        }
      }
    }
    phVar2 = ctx->error->top;
    ctx->error->top = phVar2 + -1;
    if (1 < phVar2->code) {
      if (dict != (pdf_obj *)0x0) {
        pdf_drop_obj(ctx,dict);
      }
      hd_rethrow(ctx);
    }
    return;
  }
  hd_seek(ctx,doc->file,0,2);
  iVar5 = hd_tell(ctx,doc->file);
  lVar10 = (long)(int)iVar5;
  if (lVar10 < 0x401) {
    lVar10 = 0x400;
  }
  doc->file_size = (int)iVar5;
  hd_seek(ctx,doc->file,lVar10 + -0x400,0);
  local_448 = doc;
  sVar6 = hd_read(ctx,doc->file,(uchar *)&nobj,0x400);
  if (sVar6 < 9) {
LAB_0010a069:
    pcVar12 = "cannot find startxref";
LAB_0010a3e7:
    hd_throw(ctx,2,pcVar12);
  }
  lVar10 = -sVar6;
  __s1 = (void *)((long)&local_448 + sVar6 + 7);
LAB_0010a045:
  iVar3 = bcmp(__s1,"startxref",9);
  doc = local_448;
  if (iVar3 != 0) goto code_r0x0010a057;
  uVar16 = -lVar10;
  while (((uVar16 < sVar6 && ((ulong)*(byte *)((long)&nobj + uVar16) < 0x21)) &&
         ((0x100003601U >> ((ulong)*(byte *)((long)&nobj + uVar16) & 0x3f) & 1) != 0))) {
    uVar16 = uVar16 + 1;
  }
  pbVar11 = (byte *)((long)&nobj + uVar16);
  iVar3 = 0;
  for (; iVar4 = (int)in_R8, uVar16 < sVar6; uVar16 = uVar16 + 1) {
    bVar1 = *pbVar11;
    in_R8 = CONCAT71((int7)((ulong)in_R8 >> 8),bVar1);
    iVar4 = (int)in_R8;
    if (9 < (byte)(bVar1 - 0x30)) break;
    if (iVar3 == 0x7fffffff) {
      local_448->startxref = 0x7fffffff;
      pcVar12 = "startxref too large";
      goto LAB_0010a3e7;
    }
    iVar3 = iVar3 * 10 + (uint)bVar1 + -0x30;
    pbVar11 = pbVar11 + 1;
  }
  local_448->startxref = iVar3;
  if (iVar3 != 0) {
    ppVar13 = local_448;
    pdf_read_xref_sections(ctx,local_448,(long)iVar3,&(local_448->lexbuf).base,iVar4);
    if (doc->max_xref_len == 0) {
      pcVar12 = "found xref was empty";
      goto LAB_0010a3e7;
    }
    pdf_prime_xref_index((hd_context *)doc,ppVar13);
    ppVar8 = pdf_get_xref_entry(ctx,doc,0);
    if (ppVar8->type != 'f') {
      if (ppVar8->type == '\0') {
        ppVar8->type = 'f';
        ppVar8->gen = 0xffff;
        ppVar8->num = 0;
      }
      else {
        hd_warn(ctx,"first object in xref is not free");
      }
    }
    uVar14 = doc->max_xref_len;
    i_00 = 0;
    uVar15 = 0;
    if (0 < (int)uVar14) {
      i_00 = 0;
      uVar15 = uVar14;
    }
    for (; uVar15 != i_00; i_00 = i_00 + 1) {
      ppVar8 = pdf_get_xref_entry(ctx,doc,i_00);
      if (ppVar8->type == 'o') {
        i = ppVar8->ofs;
        if ((((int)i < 1) || ((int)uVar14 <= (int)i)) ||
           (ppVar8 = pdf_get_xref_entry(ctx,doc,i), ppVar8->type != 'n')) {
          pcVar12 = "invalid reference to an objstm that does not exist: %d (%d 0 R)";
LAB_0010a403:
          hd_throw(ctx,2,pcVar12,(ulong)i,(ulong)i_00);
        }
      }
      else if (ppVar8->type == 'n') {
        i = ppVar8->ofs;
        if (i == 0) {
          ppVar8->type = 'f';
        }
        else if (((int)i < 1) || (doc->file_size <= (int)i)) {
          pcVar12 = "object offset out of range: %d (%d 0 R)";
          goto LAB_0010a403;
        }
      }
    }
    goto LAB_00109ef6;
  }
  goto LAB_0010a069;
code_r0x0010a057:
  lVar10 = lVar10 + 1;
  __s1 = (void *)((long)__s1 + -1);
  if (lVar10 == -8) goto LAB_0010a069;
  goto LAB_0010a045;
}

Assistant:

static void
pdf_init_document(hd_context *ctx, pdf_document *doc)
{
	int repaired = 0;
    int i;

    pdf_obj *dict = NULL;
    hd_var(dict);

    hd_try(ctx)
    {
        pdf_load_xref(ctx, doc, &doc->lexbuf.base);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "trying to repair broken xref");
		repaired = 1;
    }

	hd_try(ctx)
	{
		if (repaired)
		{
            pdf_obj *obj;
            pdf_obj *nobj = NULL;
            hd_var(nobj);
			/*TODO:Some files are not at the bottom of the xref*/
			/* pdf_repair_xref may access xref_index, so reset it properly */
			memset(doc->xref_index, 0, sizeof(int) * doc->max_xref_len);
			pdf_repair_xref(ctx, doc);
            pdf_prime_xref_index(ctx, doc);


            int hasroot, hasinfo;

            int xref_len = pdf_xref_len(ctx, doc);
            pdf_repair_obj_stms(ctx, doc);

            hasroot = (pdf_dict_get(ctx, pdf_trailer(ctx, doc), PDF_NAME_Root) != NULL);
            hasinfo = (pdf_dict_get(ctx, pdf_trailer(ctx, doc), PDF_NAME_Info) != NULL);

            for (i = 1; i < xref_len; i++)
            {
                pdf_xref_entry *entry = pdf_get_xref_entry(ctx, doc, i);
                if (entry->type == 0 || entry->type == 'f')
                    continue;

                hd_try(ctx)
                {
                    dict = pdf_load_object(ctx, doc, i);
					/*if (dict == NULL)
						hd_throw(ctx, HD_ERROR_GENERIC, "ignoring broken object (%d 0 R)", i);*/
                }
                hd_catch(ctx)
                {
                    hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
                    hd_warn(ctx, "ignoring broken object (%d 0 R)", i);
                    continue;
                }

                if (!hasroot)
                {

                    obj = pdf_dict_get(ctx, dict, PDF_NAME_Type);
                    if (pdf_name_eq(ctx, obj, PDF_NAME_Catalog))
                    {
                        nobj = pdf_new_indirect(ctx, doc, i, 0);
                        pdf_dict_put_drop(ctx, pdf_trailer(ctx, doc), PDF_NAME_Root, nobj);
                    }
                }

                if (!hasinfo)
                {
                    if (pdf_dict_get(ctx, dict, PDF_NAME_Creator) || pdf_dict_get(ctx, dict, PDF_NAME_Producer))
                    {
                        nobj = pdf_new_indirect(ctx, doc, i, 0);
                        pdf_dict_put_drop(ctx, pdf_trailer(ctx, doc), PDF_NAME_Info, nobj);
                    }
                }

                pdf_drop_obj(ctx, dict);
                dict = NULL;
            }

		}
	}
	hd_catch(ctx)
	{
        if (dict != NULL)
            pdf_drop_obj(ctx, dict);
        hd_rethrow(ctx);
	}
}